

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AppleII.cpp
# Opt level: O0

void __thiscall
Apple::II::ConcreteMachine<(Analyser::Static::AppleII::Target::Model)2,_true>::Keyboard::Keyboard
          (Keyboard *this,Processor *m6502)

{
  set<Inputs::Keyboard::Key,_std::less<Inputs::Keyboard::Key>,_std::allocator<Inputs::Keyboard::Key>_>
  local_48;
  Processor *local_18;
  Processor *m6502_local;
  Keyboard *this_local;
  
  local_48._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  local_48._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_48._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_48._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
  local_48._M_t._M_impl._0_8_ = 0;
  local_48._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_48._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  local_18 = m6502;
  m6502_local = (Processor *)this;
  std::
  set<Inputs::Keyboard::Key,_std::less<Inputs::Keyboard::Key>,_std::allocator<Inputs::Keyboard::Key>_>
  ::set(&local_48);
  Inputs::Keyboard::Keyboard(&this->super_Keyboard,&local_48);
  std::
  set<Inputs::Keyboard::Key,_std::less<Inputs::Keyboard::Key>,_std::allocator<Inputs::Keyboard::Key>_>
  ::~set(&local_48);
  (this->super_Keyboard)._vptr_Keyboard = (_func_int **)&PTR__Keyboard_00c9a0b8;
  this->open_apple_is_pressed = false;
  this->closed_apple_is_pressed = false;
  this->keyboard_input_ = '\0';
  this->key_is_down_ = false;
  this->last_pressed_character_ = '\0';
  this->character_is_pressed_ = false;
  this->repeat_is_pressed_ = false;
  this->shift_is_pressed_ = false;
  this->control_is_pressed_ = false;
  std::unique_ptr<Utility::StringSerialiser,std::default_delete<Utility::StringSerialiser>>::
  unique_ptr<std::default_delete<Utility::StringSerialiser>,void>
            ((unique_ptr<Utility::StringSerialiser,std::default_delete<Utility::StringSerialiser>> *
             )&this->string_serialiser_);
  this->m6502_ = local_18;
  return;
}

Assistant:

Keyboard(Processor *m6502) : m6502_(m6502) {}